

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

bool google::protobuf::internal::TcParser::ChangeOneof
               (TcParseTableBase *table,FieldEntry *entry,uint32_t field_num,ParseContext *ctx,
               MessageLite *msg)

{
  ushort uVar1;
  uint32_t field_num_00;
  Cord *this;
  uint *puVar2;
  FieldEntry *pFVar3;
  ArenaStringPtr *this_00;
  MessageLite **ppMVar4;
  Cord **ppCVar5;
  LogMessage *pLVar6;
  ulong uVar7;
  bool bVar8;
  uint v;
  LogMessageDebugFatal local_30 [16];
  
  puVar2 = RefAt<unsigned_int>(msg,(long)entry->has_idx);
  field_num_00 = *puVar2;
  *puVar2 = field_num;
  bVar8 = true;
  if (field_num_00 != 0) {
    if (field_num_00 == field_num) {
      bVar8 = false;
    }
    else {
      pFVar3 = FindFieldEntry(table,field_num_00);
      uVar1 = pFVar3->type_card;
      if ((uVar1 & 7) == 6) {
        if ((uVar1 & 0x180) == 0) {
          ppMVar4 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)pFVar3->offset);
          uVar7 = (msg->_internal_metadata_).ptr_;
          if ((uVar7 & 1) != 0) {
            uVar7 = *(ulong *)(uVar7 & 0xfffffffffffffffe);
          }
          if (uVar7 != 0) {
            return true;
          }
          if (*ppMVar4 == (MessageLite *)0x0) {
            return true;
          }
          (*(*ppMVar4)->_vptr_MessageLite[1])();
          return true;
        }
        absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x68a);
        pLVar6 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           ((LogMessage *)local_30,(char (*) [26])"message rep not handled: ");
        absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar6,(uVar1 & 0x1c0) >> 6);
      }
      else {
        if ((uVar1 & 7) != 5) {
          return true;
        }
        v = (uVar1 & 0x1c0) >> 6;
        if (v == 2) {
          uVar7 = (msg->_internal_metadata_).ptr_;
          if ((uVar7 & 1) != 0) {
            uVar7 = *(ulong *)(uVar7 & 0xfffffffffffffffe);
          }
          if (uVar7 != 0) {
            return true;
          }
          ppCVar5 = RefAt<absl::lts_20240722::Cord*>(msg,(ulong)pFVar3->offset);
          this = *ppCVar5;
          if (this != (Cord *)0x0) {
            absl::lts_20240722::Cord::~Cord(this);
          }
          operator_delete(this,0x10);
          return true;
        }
        if ((uVar1 & 0x1c0) == 0) {
          this_00 = RefAt<google::protobuf::internal::ArenaStringPtr>(msg,(ulong)pFVar3->offset);
          ArenaStringPtr::Destroy(this_00);
          return true;
        }
        absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x67b);
        pLVar6 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           ((LogMessage *)local_30,(char (*) [25])"string rep not handled: ");
        absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar6,v);
      }
      absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(local_30);
    }
  }
  return bVar8;
}

Assistant:

bool TcParser::ChangeOneof(const TcParseTableBase* table,
                           const TcParseTableBase::FieldEntry& entry,
                           uint32_t field_num, ParseContext* ctx,
                           MessageLite* msg) {
  // The _oneof_case_ value offset is stored in the has-bit index.
  uint32_t* oneof_case = &TcParser::RefAt<uint32_t>(msg, entry.has_idx);
  uint32_t current_case = *oneof_case;
  *oneof_case = field_num;

  if (current_case == 0) {
    // If the member is empty, we don't have anything to clear. Caller is
    // responsible for creating a new member object.
    return true;
  }
  if (current_case == field_num) {
    // If the member is already active, then it should be merged. We're done.
    return false;
  }
  // Look up the value that is already stored, and dispose of it if necessary.
  const FieldEntry* current_entry = FindFieldEntry(table, current_case);
  uint16_t current_kind = current_entry->type_card & field_layout::kFkMask;
  uint16_t current_rep = current_entry->type_card & field_layout::kRepMask;
  if (current_kind == field_layout::kFkString) {
    switch (current_rep) {
      case field_layout::kRepAString: {
        auto& field = RefAt<ArenaStringPtr>(msg, current_entry->offset);
        field.Destroy();
        break;
      }
      case field_layout::kRepCord: {
        if (msg->GetArena() == nullptr) {
          delete RefAt<absl::Cord*>(msg, current_entry->offset);
        }
        break;
      }
      case field_layout::kRepSString:
      case field_layout::kRepIString:
      default:
        ABSL_DLOG(FATAL) << "string rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        return true;
    }
  } else if (current_kind == field_layout::kFkMessage) {
    switch (current_rep) {
      case field_layout::kRepMessage:
      case field_layout::kRepGroup: {
        auto& field = RefAt<MessageLite*>(msg, current_entry->offset);
        if (!msg->GetArena()) {
          delete field;
        }
        break;
      }
      default:
        ABSL_DLOG(FATAL) << "message rep not handled: "
                         << (current_rep >> field_layout::kRepShift);
        break;
    }
  }
  return true;
}